

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

void __thiscall Js::JavascriptLibrary::EnqueueTask(JavascriptLibrary *this,Var taskVar)

{
  int32 *piVar1;
  ScriptContext *pSVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  EventLogEntry *evt;
  undefined1 local_58 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  
  bVar5 = VarIs<Js::JavascriptFunction>(taskVar);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1424,"(VarIs<JavascriptFunction>(taskVar))",
                                "VarIs<JavascriptFunction>(taskVar)");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  pSVar2 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  if (this->nativeHostPromiseContinuationFunction == (Type)0x0) {
    if (pSVar2->TTDShouldPerformRecordOrReplayAction == true) {
      TTDAbort_unrecoverable_error("Path not implemented in TTD!!!");
    }
    iVar6 = (*pSVar2->hostScriptContext->_vptr_HostScriptContext[0x11])
                      (pSVar2->hostScriptContext,taskVar);
    if (iVar6 != 0) {
      JavascriptError::MapAndThrowError
                ((this->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5e9bc);
    }
  }
  else {
    if (pSVar2 == (ScriptContext *)0x0) {
      TTDAbort_unrecoverable_error("We shouldn\'t be adding tasks if this is the case???");
    }
    if (pSVar2->TTDShouldPerformReplayAction == true) {
      pTVar3 = pSVar2->threadContext;
      piVar1 = &pTVar3->TTDRootNestingCount;
      *piVar1 = *piVar1 + 1;
      TTD::EventLog::ReplayEnqueueTaskEvent(pTVar3->TTDLog,pSVar2,taskVar);
    }
    else {
      if (pSVar2->TTDShouldPerformRecordAction != true) {
        LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                  ((LeaveScriptObject<true,_true,_false> *)local_58,pSVar2,&stack0xfffffffffffffff8)
        ;
        pTVar3 = ((this->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
        bVar5 = pTVar3->reentrancySafeOrHandled;
        pTVar3->reentrancySafeOrHandled = true;
        (*this->nativeHostPromiseContinuationFunction)
                  (taskVar,(this->nativeHostPromiseContinuationFunctionState).ptr);
        pSVar2 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
        if (pSVar2 != (ScriptContext *)0x0) {
          ThreadContext::DisposeOnLeaveScript(pSVar2->threadContext);
        }
        pTVar3->reentrancySafeOrHandled = bVar5;
        LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                  ((LeaveScriptObject<true,_true,_false> *)local_58);
        return;
      }
      pTVar3 = pSVar2->threadContext;
      piVar1 = &pTVar3->TTDRootNestingCount;
      *piVar1 = *piVar1 + 1;
      evt = TTD::EventLog::RecordEnqueueTaskEvent(pTVar3->TTDLog,taskVar);
      LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                ((LeaveScriptObject<true,_true,_false> *)local_58,
                 (this->super_JavascriptLibraryBase).scriptContext.ptr,&stack0xfffffffffffffff8);
      pTVar3 = ((this->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
      bVar5 = pTVar3->reentrancySafeOrHandled;
      pTVar3->reentrancySafeOrHandled = true;
      (*this->nativeHostPromiseContinuationFunction)
                (taskVar,(this->nativeHostPromiseContinuationFunctionState).ptr);
      pSVar2 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
      if (pSVar2 != (ScriptContext *)0x0) {
        ThreadContext::DisposeOnLeaveScript(pSVar2->threadContext);
      }
      pTVar3->reentrancySafeOrHandled = bVar5;
      LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                ((LeaveScriptObject<true,_true,_false> *)local_58);
      TTD::EventLog::RecordEnqueueTaskEvent_Complete
                (((this->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext->TTDLog,evt)
      ;
    }
    piVar1 = &((this->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext->
              TTDRootNestingCount;
    *piVar1 = *piVar1 + -1;
  }
  return;
}

Assistant:

void JavascriptLibrary::EnqueueTask(Var taskVar)
    {
        Assert(VarIs<JavascriptFunction>(taskVar));

        if(this->nativeHostPromiseContinuationFunction)
        {
#if ENABLE_TTD
            TTDAssert(this->scriptContext != nullptr, "We shouldn't be adding tasks if this is the case???");

            if(this->scriptContext->ShouldPerformReplayAction())
            {
                this->scriptContext->GetThreadContext()->TTDRootNestingCount++;

                this->scriptContext->GetThreadContext()->TTDLog->ReplayEnqueueTaskEvent(scriptContext, taskVar);

                this->scriptContext->GetThreadContext()->TTDRootNestingCount--;
            }
            else if(this->scriptContext->ShouldPerformRecordAction())
            {
                this->scriptContext->GetThreadContext()->TTDRootNestingCount++;
                TTD::NSLogEvents::EventLogEntry* evt = this->scriptContext->GetThreadContext()->TTDLog->RecordEnqueueTaskEvent(taskVar);

                BEGIN_LEAVE_SCRIPT(this->scriptContext);
                try
                {
                    this->nativeHostPromiseContinuationFunction(taskVar, this->nativeHostPromiseContinuationFunctionState);
                }
                catch(...)
                {
                    // Hosts are required not to pass exceptions back across the callback boundary. If
                    // this happens, it is a bug in the host, not something that we are expected to
                    // handle gracefully.
                    Js::Throw::FatalInternalError();
                }
                END_LEAVE_SCRIPT(this->scriptContext);

                this->scriptContext->GetThreadContext()->TTDLog->RecordEnqueueTaskEvent_Complete(evt);
                this->scriptContext->GetThreadContext()->TTDRootNestingCount--;
            }
            else
            {
                BEGIN_LEAVE_SCRIPT(scriptContext);
                try
                {
                    this->nativeHostPromiseContinuationFunction(taskVar, this->nativeHostPromiseContinuationFunctionState);
                }
                catch(...)
                {
                    // Hosts are required not to pass exceptions back across the callback boundary. If
                    // this happens, it is a bug in the host, not something that we are expected to
                    // handle gracefully.
                    Js::Throw::FatalInternalError();
                }
                END_LEAVE_SCRIPT(scriptContext);
            }
#else
            BEGIN_LEAVE_SCRIPT(scriptContext);
            try
            {
                this->nativeHostPromiseContinuationFunction(taskVar, this->nativeHostPromiseContinuationFunctionState);
            }
            catch (...)
            {
                // Hosts are required not to pass exceptions back across the callback boundary. If
                // this happens, it is a bug in the host, not something that we are expected to
                // handle gracefully.
                Js::Throw::FatalInternalError();
            }
            END_LEAVE_SCRIPT(scriptContext);
#endif
        }
        else
        {
#if ENABLE_TTD
            if(this->scriptContext->ShouldPerformRecordOrReplayAction())
            {
                //
                //TODO: need to implement support for this path
                //
                TTDAssert(false, "Path not implemented in TTD!!!");
            }
#endif

            HRESULT hr = scriptContext->GetHostScriptContext()->EnqueuePromiseTask(taskVar);
            if (hr != S_OK)
            {
                Js::JavascriptError::MapAndThrowError(scriptContext, JSERR_HostMaybeMissingPromiseContinuationCallback);
            }
        }
    }